

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O1

bool HasGenericProperty<int>
               (map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                *list,char *szName)

{
  uint uVar1;
  uint uVar2;
  _Rb_tree_color _Var3;
  size_t sVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  uint uVar8;
  bool bVar9;
  
  if (szName == (char *)0x0) {
    __assert_fail("nullptr != szName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/GenericProperty.h"
                  ,0x7f,
                  "bool HasGenericProperty(const std::map<unsigned int, T> &, const char *) [T = int]"
                 );
  }
  sVar4 = strlen(szName);
  uVar2 = (uint)sVar4;
  uVar8 = 0;
  if (3 < uVar2) {
    uVar1 = uVar2 >> 2;
    uVar8 = 0;
    do {
      uVar8 = (*(ushort *)szName + uVar8) * 0x10000 ^
              ((uint)(byte)*(ushort *)((long)szName + 2) << 0xb |
              (uint)*(byte *)((long)szName + 3) << 0x13) ^ *(ushort *)szName + uVar8;
      szName = (char *)((long)szName + 4);
      uVar8 = (uVar8 >> 0xb) + uVar8;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  switch(uVar2 & 3) {
  case 0:
    goto switchD_002fda9f_caseD_0;
  case 1:
    uVar8 = uVar8 + (int)(char)*(ushort *)szName;
    uVar2 = uVar8 * 0x400 ^ uVar8;
    uVar8 = uVar2 >> 1;
    break;
  case 2:
    uVar8 = (*(ushort *)szName + uVar8) * 0x800 ^ *(ushort *)szName + uVar8;
    uVar8 = (uVar8 >> 0x11) + uVar8;
    goto switchD_002fda9f_caseD_0;
  case 3:
    uVar2 = (*(ushort *)szName + uVar8) * 0x10000 ^
            (int)(char)*(ushort *)((long)szName + 2) << 0x12 ^ *(ushort *)szName + uVar8;
    uVar8 = uVar2 >> 0xb;
  }
  uVar8 = uVar8 + uVar2;
switchD_002fda9f_caseD_0:
  uVar8 = uVar8 * 8 ^ uVar8;
  uVar8 = (uVar8 >> 5) + uVar8;
  uVar8 = uVar8 * 0x10 ^ uVar8;
  uVar8 = (uVar8 >> 0x11) + uVar8;
  uVar8 = uVar8 * 0x2000000 ^ uVar8;
  _Var3 = (uVar8 >> 6) + uVar8;
  p_Var7 = &(list->_M_t)._M_impl.super__Rb_tree_header;
  p_Var6 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var7->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[bVar9]) {
    bVar9 = p_Var6[1]._M_color < _Var3;
    if (!bVar9) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var7->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var7) && (p_Var6 = p_Var5, _Var3 < p_Var5[1]._M_color)) {
    p_Var6 = &p_Var7->_M_header;
  }
  return (_Rb_tree_header *)p_Var6 != p_Var7;
}

Assistant:

inline
bool HasGenericProperty(const std::map< unsigned int, T >& list,
        const char* szName) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::const_iterator it = list.find(hash);
    if (it == list.end()) {
        return false;
    }

    return true;
}